

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O2

Item * __thiscall World::add_gold_item(World *this,uint8_t worth)

{
  uint16_t gold_value;
  char cVar1;
  byte bVar2;
  undefined8 in_RAX;
  size_type sVar3;
  mapped_type *ppIVar4;
  Item *item;
  undefined7 in_register_00000031;
  uint8_t id;
  undefined8 uStack_28;
  
  gold_value = (uint16_t)CONCAT71(in_register_00000031,worth);
  bVar2 = 0x40;
  id = '@';
  uStack_28 = in_RAX;
  while( true ) {
    uStack_28 = CONCAT17(bVar2,(undefined7)uStack_28);
    if ((0x6f < bVar2) ||
       (sVar3 = std::
                map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                ::count(&this->_items,(key_type_conflict *)((long)&uStack_28 + 7)), sVar3 == 0))
    break;
    cVar1 = uStack_28._7_1_;
    ppIVar4 = std::
              map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
              ::operator[](&this->_items,(key_type_conflict *)((long)&uStack_28 + 7));
    if ((*ppIVar4)->_gold_value == gold_value) {
      ppIVar4 = std::
                map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                ::operator[](&this->_items,(key_type_conflict *)((long)&uStack_28 + 7));
      return *ppIVar4;
    }
    id = cVar1 + '\x01';
    bVar2 = uStack_28._7_1_ + 1;
  }
  if (id == 'p') {
    item = (Item *)0x0;
  }
  else {
    item = (Item *)operator_new(0x40);
    ItemGolds::ItemGolds((ItemGolds *)item,id,gold_value);
    add_item(this,item);
  }
  return item;
}

Assistant:

Item* World::add_gold_item(uint8_t worth)
{
    uint8_t first_available_id = ITEM_GOLDS_START;

    // Try to find an item with the same worth
    for(uint8_t i=ITEM_GOLDS_START ; i<ITEM_GOLDS_END ; ++i)
    {
        if(_items.count(i) == 0)
            break;

        first_available_id = i+1;
        if(_items[i]->gold_value() == worth)
            return _items[i];
    }

    // If we consumed all item IDs, don't add it you fool!
    if(first_available_id == ITEM_GOLDS_END)
        return nullptr;

    return this->add_item(new ItemGolds(first_available_id, worth));
}